

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::close85(Fl_PostScript_Graphics_Driver *this,void *data)

{
  int iVar1;
  int local_24;
  int l;
  struct85 *big;
  void *data_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  if (*(int *)((long)data + 4) != 0) {
    local_24 = *(int *)((long)data + 4);
    while (local_24 < 4) {
      *(undefined1 *)((long)data + (long)local_24) = 0;
      local_24 = local_24 + 1;
    }
    iVar1 = convert85((uchar *)data,(uchar *)((long)data + 0xc));
    if (iVar1 == 1) {
      memset((void *)((long)data + 0xc),0x21,5);
    }
    fwrite((void *)((long)data + 0xc),(long)(*(int *)((long)data + 4) + 1),1,(FILE *)this->output);
  }
  fputs("~>",(FILE *)this->output);
  if (data != (void *)0x0) {
    operator_delete(data,0x14);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::close85(void *data)  // stops ASCII85-encoding after processing remaining unencoded input bytes, if any
{
  struct85 *big = (struct85 *)data;
  int l;
  if (big->l4) { // # of remaining unencoded input bytes
    l = big->l4;
    while (l < 4) big->bytes4[l++] = 0; // complete them with 0s
    l = convert85(big->bytes4, big->chars5); // encode them
    if (l == 1) memset(big->chars5, '!', 5);
    fwrite(big->chars5, big->l4 + 1, 1, output);
  }
  fputs("~>", output); // write EOD mark
  delete big;
}